

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

uchar * valid_star(uchar *p,size_t len,uint flags)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int atend;
  int atstart;
  int dots;
  int state;
  size_t i;
  uchar *star;
  uint flags_local;
  size_t len_local;
  uchar *p_local;
  
  i = 0;
  atstart = 1;
  bVar1 = false;
  atend = 0;
  _dots = 0;
  do {
    if (len <= _dots) {
      if ((atstart == 0) && (1 < atend)) {
        p_local = (uchar *)i;
      }
      else {
        p_local = (uchar *)0x0;
      }
      return p_local;
    }
    if (p[_dots] == '*') {
      bVar3 = true;
      if (_dots != len - 1) {
        bVar3 = p[_dots + 1] == '.';
      }
      if (((i != 0) || (bVar1)) || (atend != 0)) {
        return (uchar *)0x0;
      }
      if (((atstart & 1U) == 0) || (!bVar3)) {
        return (uchar *)0x0;
      }
      i = (size_t)(p + _dots);
      atstart = atstart & 0xfffffffe;
    }
    else {
      iVar2 = OPENSSL_isalnum((uint)p[_dots]);
      if (iVar2 == 0) {
        if (p[_dots] == '.') {
          if (atstart != 0) {
            return (uchar *)0x0;
          }
          atstart = 1;
          bVar1 = false;
          atend = atend + 1;
        }
        else {
          if (p[_dots] != '-') {
            return (uchar *)0x0;
          }
          if ((atstart & 1U) != 0) {
            return (uchar *)0x0;
          }
          atstart = atstart | 4;
        }
      }
      else {
        if ((((atstart & 1U) != 0) && (3 < len - _dots)) &&
           (iVar2 = OPENSSL_strncasecmp((char *)(p + _dots),"xn--",4), iVar2 == 0)) {
          bVar1 = true;
        }
        atstart = 0;
      }
    }
    _dots = _dots + 1;
  } while( true );
}

Assistant:

static const unsigned char *valid_star(const unsigned char *p, size_t len,
                                       unsigned int flags) {
  const unsigned char *star = 0;
  size_t i;
  int state = LABEL_START;
  int dots = 0;
  for (i = 0; i < len; ++i) {
    // Locate first and only legal wildcard, either at the start
    // or end of a non-IDNA first and not final label.
    if (p[i] == '*') {
      int atstart = (state & LABEL_START);
      int atend = (i == len - 1 || p[i + 1] == '.');
      // At most one wildcard per pattern.
      // No wildcards in IDNA labels.
      // No wildcards after the first label.
      if (star != NULL || (state & LABEL_IDNA) != 0 || dots) {
        return NULL;
      }
      // Only full-label '*.example.com' wildcards.
      if (!atstart || !atend) {
        return NULL;
      }
      star = &p[i];
      state &= ~LABEL_START;
    } else if (OPENSSL_isalnum(p[i])) {
      if ((state & LABEL_START) != 0 && len - i >= 4 &&
          OPENSSL_strncasecmp((char *)&p[i], "xn--", 4) == 0) {
        state |= LABEL_IDNA;
      }
      state &= ~(LABEL_HYPHEN | LABEL_START);
    } else if (p[i] == '.') {
      if ((state & (LABEL_HYPHEN | LABEL_START)) != 0) {
        return NULL;
      }
      state = LABEL_START;
      ++dots;
    } else if (p[i] == '-') {
      // no domain/subdomain starts with '-'
      if ((state & LABEL_START) != 0) {
        return NULL;
      }
      state |= LABEL_HYPHEN;
    } else {
      return NULL;
    }
  }

  // The final label must not end in a hyphen or ".", and
  // there must be at least two dots after the star.
  if ((state & (LABEL_START | LABEL_HYPHEN)) != 0 || dots < 2) {
    return NULL;
  }
  return star;
}